

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetLayoutElementString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,LayoutElement *Element)

{
  int iVar1;
  ostream *poVar2;
  Char *pCVar3;
  char *pcVar4;
  bool local_1fa;
  allocator local_1f9;
  string local_1f8;
  byte local_1d2;
  allocator local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Diligent *local_18;
  LayoutElement *Element_local;
  
  local_18 = this;
  Element_local = (LayoutElement *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"HLSLSemantic: ");
  poVar2 = std::operator<<(poVar2,*(char **)local_18);
  poVar2 = std::operator<<(poVar2,", InputIndex: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_18 + 8));
  poVar2 = std::operator<<(poVar2,", BufferSlot: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_18 + 0xc));
  poVar2 = std::operator<<(poVar2,", NumComponents: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_18 + 0x10));
  poVar2 = std::operator<<(poVar2,", ValueType: ");
  pCVar3 = GetValueTypeString((VALUE_TYPE)local_18[0x14]);
  poVar2 = std::operator<<(poVar2,pCVar3);
  poVar2 = std::operator<<(poVar2,", IsNormalized: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)((byte)local_18[0x15] & 1));
  poVar2 = std::operator<<(poVar2,", RelativeOffset: ");
  local_1d2 = 0;
  if (*(int *)(local_18 + 0x18) == -1) {
    std::allocator<char>::allocator();
    local_1d2 = 1;
    std::__cxx11::string::string((string *)&local_1d0,"auto",&local_1d1);
  }
  else {
    std::__cxx11::to_string(&local_1d0,*(uint *)(local_18 + 0x18));
  }
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,", Stride: ");
  iVar1 = *(int *)(local_18 + 0x1c);
  if (iVar1 != -1) {
    std::__cxx11::to_string(&local_1f8,*(uint *)(local_18 + 0x1c));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"auto",&local_1f9);
  }
  local_1fa = iVar1 == -1;
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,", Frequency: ");
  pcVar4 = GetInputElementFrequencyString((INPUT_ELEMENT_FREQUENCY)local_18[0x20]);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,", InstanceDataStepRate: ");
  std::ostream::operator<<(poVar2,*(uint *)(local_18 + 0x24));
  std::__cxx11::string::~string((string *)&local_1f8);
  if (local_1fa) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  if ((local_1d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

String GetLayoutElementString(const LayoutElement& Element)
{
    std::stringstream ss;
    ss << "HLSLSemantic: " << Element.HLSLSemantic
       << ", InputIndex: " << Element.InputIndex
       << ", BufferSlot: " << Element.BufferSlot
       << ", NumComponents: " << Element.NumComponents
       << ", ValueType: " << GetValueTypeString(Element.ValueType)
       << ", IsNormalized: " << Element.IsNormalized
       << ", RelativeOffset: " << (Element.RelativeOffset == LAYOUT_ELEMENT_AUTO_OFFSET ? "auto" : std::to_string(Element.RelativeOffset))
       << ", Stride: " << (Element.Stride == LAYOUT_ELEMENT_AUTO_STRIDE ? "auto" : std::to_string(Element.Stride))
       << ", Frequency: " << GetInputElementFrequencyString(Element.Frequency)
       << ", InstanceDataStepRate: " << Element.InstanceDataStepRate;

    return ss.str();
}